

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

int deqp::gls::generateRandomAttribData
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *attrDataBuf,
              int *dataSizeBytesDst,VarSpec *attrSpec,int numVertices,Random *rnd)

{
  float fVar1;
  float fVar2;
  DataType dataType;
  pointer puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int compNdx;
  ulong uVar8;
  ulong uVar9;
  int compNdx_1;
  int iVar10;
  int iVar11;
  float fVar12;
  
  dataType = attrSpec->type;
  uVar4 = glu::getDataTypeScalarSize(dataType);
  iVar10 = 0;
  iVar7 = *(int *)&(attrDataBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
          *(int *)&(attrDataBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
  if (iVar7 != 0) {
    iVar10 = (iVar7 - (iVar7 + -1) % 4) + 3;
  }
  *dataSizeBytesDst = uVar4 * numVertices * 4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (attrDataBuf,(long)(int)(iVar10 + uVar4 * numVertices * 4));
  puVar3 = (attrDataBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = 0;
  if (0 < (int)uVar4) {
    uVar9 = (ulong)uVar4;
  }
  iVar7 = 0;
  if (0 < numVertices) {
    iVar7 = numVertices;
  }
  if (dataType - TYPE_FLOAT < 4) {
    iVar11 = 0;
    for (iVar5 = 0; iVar5 != iVar7; iVar5 = iVar5 + 1) {
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        fVar1 = *(float *)((long)&attrSpec->minValue + uVar8 * 4);
        fVar2 = *(float *)((long)&attrSpec->maxValue + uVar8 * 4);
        fVar12 = deRandom_getFloat(&rnd->m_rnd);
        *(float *)(puVar3 + (long)(iVar11 + (int)uVar8) * 4 + (long)iVar10) =
             fVar12 * (fVar2 - fVar1) + fVar1;
      }
      iVar11 = iVar11 + uVar4;
    }
  }
  else {
    iVar11 = 0;
    for (iVar5 = 0; iVar5 != iVar7; iVar5 = iVar5 + 1) {
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        iVar6 = de::Random::getInt(rnd,*(int *)((long)&attrSpec->minValue + uVar8 * 4),
                                   *(int *)((long)&attrSpec->maxValue + uVar8 * 4));
        *(int *)(puVar3 + (long)(iVar11 + (int)uVar8) * 4 + (long)iVar10) = iVar6;
      }
      iVar11 = iVar11 + uVar4;
    }
  }
  return iVar10;
}

Assistant:

static int generateRandomAttribData (vector<deUint8>& attrDataBuf, int& dataSizeBytesDst, const VarSpec& attrSpec, const int numVertices, Random& rnd)
{
	const bool	isFloat			= glu::isDataTypeFloatOrVec(attrSpec.type);
	const int	numComponents	= glu::getDataTypeScalarSize(attrSpec.type);
	const int	componentSize	= (int)(isFloat ? sizeof(GLfloat) : sizeof(GLint));
	const int	offsetInBuf		= nextDivisible((int)attrDataBuf.size(), componentSize); // Round up for alignment.

	DE_STATIC_ASSERT(sizeof(GLint) == sizeof(int));
	DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(float));

	dataSizeBytesDst = numComponents*componentSize*numVertices;

	attrDataBuf.resize(offsetInBuf + dataSizeBytesDst);

	if (isFloat)
	{
		float* const data = (float*)&attrDataBuf[offsetInBuf];

		for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx++)
			for (int compNdx = 0; compNdx < numComponents; compNdx++)
				data[vtxNdx*numComponents + compNdx] = rnd.getFloat(attrSpec.minValue.f[compNdx], attrSpec.maxValue.f[compNdx]);
	}
	else
	{
		DE_ASSERT(glu::isDataTypeIntOrIVec(attrSpec.type));

		int* const data = (int*)&attrDataBuf[offsetInBuf];

		for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx++)
			for (int compNdx = 0; compNdx < numComponents; compNdx++)
				data[vtxNdx*numComponents + compNdx] = rnd.getInt(attrSpec.minValue.i[compNdx], attrSpec.maxValue.i[compNdx]);
	}

	return offsetInBuf;
}